

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_object_memory(void)

{
  _Bool _Var1;
  object_kind *kind_00;
  object_kind *kind;
  uint8_t tmp8u;
  wchar_t k_idx;
  
  wr_u16b(z_info->k_max);
  wr_byte('\x05');
  wr_byte('\x10');
  wr_byte('\x19');
  wr_byte(z_info->brand_max);
  wr_byte(z_info->slay_max);
  wr_byte(z_info->curse_max);
  for (kind._4_4_ = 0; kind._4_4_ < (int)(uint)z_info->k_max; kind._4_4_ = kind._4_4_ + 1) {
    kind_00 = k_info + kind._4_4_;
    kind._3_1_ = (kind_00->aware & 1U) != 0;
    if ((kind_00->tried & 1U) != 0) {
      kind._3_1_ = kind._3_1_ | 2;
    }
    _Var1 = kind_is_ignored_aware(kind_00);
    if (_Var1) {
      kind._3_1_ = kind._3_1_ | 4;
    }
    if ((kind_00->everseen & 1U) != 0) {
      kind._3_1_ = kind._3_1_ | 8;
    }
    _Var1 = kind_is_ignored_unaware(kind_00);
    if (_Var1) {
      kind._3_1_ = kind._3_1_ | 0x10;
    }
    wr_byte(kind._3_1_);
  }
  return;
}

Assistant:

void wr_object_memory(void)
{
	int k_idx;

	wr_u16b(z_info->k_max);
	wr_byte(OF_SIZE);
	wr_byte(OBJ_MOD_MAX);
	wr_byte(ELEM_MAX);
	wr_byte(z_info->brand_max);
	wr_byte(z_info->slay_max);
	wr_byte(z_info->curse_max);

	/* Kind knowledge */
	for (k_idx = 0; k_idx < z_info->k_max; k_idx++) {
		uint8_t tmp8u = 0;
		struct object_kind *kind = &k_info[k_idx];

		if (kind->aware) tmp8u |= 0x01;
		if (kind->tried) tmp8u |= 0x02;
		if (kind_is_ignored_aware(kind)) tmp8u |= 0x04;
		if (kind->everseen) tmp8u |= 0x08;
		if (kind_is_ignored_unaware(kind)) tmp8u |= 0x10;

		wr_byte(tmp8u);
	}
}